

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_probe_side_optimizer.cpp
# Opt level: O1

void duckdb::GetRowidBindings(LogicalOperator *op,vector<duckdb::ColumnBinding,_true> *bindings)

{
  pointer *ppCVar1;
  pointer pCVar2;
  pointer pCVar3;
  iterator __position;
  pointer puVar4;
  idx_t iVar5;
  LogicalGet *this;
  vector<duckdb::ColumnIndex,_true> *pvVar6;
  type op_00;
  pointer pCVar7;
  bool bVar8;
  vector<duckdb::ColumnBinding,_true> *__range3;
  ColumnBinding *binding;
  ColumnBinding *__args;
  pointer this_00;
  vector<duckdb::ColumnBinding,_true> get_bindings;
  ColumnBinding *local_38;
  ColumnBinding *local_30;
  
  if (op->type == LOGICAL_GET) {
    this = LogicalOperator::Cast<duckdb::LogicalGet>(op);
    (*(this->super_LogicalOperator)._vptr_LogicalOperator[2])(&local_38,this);
    pvVar6 = LogicalGet::GetColumnIds(this);
    pCVar2 = (pvVar6->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
             super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
             super__Vector_impl_data._M_start;
    pCVar3 = (pvVar6->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
             super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pCVar2 != pCVar3) {
      bVar8 = false;
      do {
        pCVar7 = pCVar2 + 1;
        if (pCVar2->index == 0xffffffffffffffff) {
          bVar8 = true;
          break;
        }
        pCVar2 = pCVar7;
      } while (pCVar7 != pCVar3);
      __args = local_38;
      if (bVar8) {
        for (; __args != local_30; __args = __args + 1) {
          __position._M_current =
               (bindings->
               super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
               super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (bindings->super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
              ).super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>>::
            _M_realloc_insert<duckdb::ColumnBinding_const&>
                      ((vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>> *)
                       bindings,__position,__args);
          }
          else {
            iVar5 = __args->column_index;
            (__position._M_current)->table_index = __args->table_index;
            (__position._M_current)->column_index = iVar5;
            ppCVar1 = &(bindings->
                       super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
                       super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppCVar1 = *ppCVar1 + 1;
          }
        }
      }
    }
    if (local_38 != (ColumnBinding *)0x0) {
      operator_delete(local_38);
    }
  }
  puVar4 = (op->children).
           super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (op->children).
                 super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar4; this_00 = this_00 + 1
      ) {
    op_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator*(this_00);
    GetRowidBindings(op_00,bindings);
  }
  return;
}

Assistant:

static void GetRowidBindings(LogicalOperator &op, vector<ColumnBinding> &bindings) {
	if (op.type == LogicalOperatorType::LOGICAL_GET) {
		auto &get = op.Cast<LogicalGet>();
		auto get_bindings = get.GetColumnBindings();
		auto &column_ids = get.GetColumnIds();
		bool has_row_id = false;
		for (auto &col_id : column_ids) {
			if (col_id.IsRowIdColumn()) {
				has_row_id = true;
				break;
			}
		}
		if (has_row_id) {
			for (auto &binding : get_bindings) {
				bindings.push_back(binding);
			}
		}
	}
	for (auto &child : op.children) {
		GetRowidBindings(*child, bindings);
	}
}